

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wast-parser.cpp
# Opt level: O2

double __thiscall wasm::WATParser::anon_unknown_21::nan(anon_unknown_21 *this,char *__tagb)

{
  bool bVar1;
  double extraout_XMM0_Qa;
  double extraout_XMM0_Qa_00;
  double dVar2;
  string_view expected;
  string_view expected_00;
  string local_68;
  Err local_48;
  allocator<char> local_21;
  
  expected._M_str = "nan:canonical";
  expected._M_len = 0xd;
  bVar1 = Lexer::takeKeyword((Lexer *)__tagb,expected);
  if (bVar1) {
    *(undefined4 *)this = 0;
    dVar2 = extraout_XMM0_Qa;
  }
  else {
    expected_00._M_str = "nan:arithmetic";
    expected_00._M_len = 0xe;
    bVar1 = Lexer::takeKeyword((Lexer *)__tagb,expected_00);
    if (!bVar1) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_68,"expected NaN result pattern",&local_21);
      Lexer::err(&local_48,(Lexer *)__tagb,&local_68);
      std::__detail::__variant::_Variant_storage<false,wasm::WATParser::NaNKind,wasm::Err>::
      _Variant_storage<1ul,wasm::Err>
                ((_Variant_storage<false,wasm::WATParser::NaNKind,wasm::Err> *)this,&local_48);
      std::__cxx11::string::~string((string *)&local_48);
      dVar2 = (double)std::__cxx11::string::~string((string *)&local_68);
      return dVar2;
    }
    *(undefined4 *)this = 1;
    dVar2 = extraout_XMM0_Qa_00;
  }
  this[0x20] = (anon_unknown_21)0x0;
  return dVar2;
}

Assistant:

Result<NaNKind> nan(Lexer& in) {
  if (in.takeKeyword("nan:canonical"sv)) {
    return NaNKind::Canonical;
  }
  if (in.takeKeyword("nan:arithmetic"sv)) {
    return NaNKind::Arithmetic;
  }
  return in.err("expected NaN result pattern");
}